

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.h
# Opt level: O0

void __thiscall
llvm::yaml::IO::enumFallback<llvm::yaml::Hex16,llvm::dwarf::Attribute>(IO *this,Attribute *Val)

{
  uint uVar1;
  Attribute *pAVar2;
  Hex16 local_1c;
  EmptyContext local_19;
  Hex16 Res;
  Attribute *pAStack_18;
  EmptyContext Context;
  Attribute *Val_local;
  IO *this_local;
  
  pAStack_18 = Val;
  uVar1 = (*this->_vptr_IO[0x16])();
  if ((uVar1 & 1) != 0) {
    Hex16::Hex16(&local_1c,*pAStack_18);
    yamlize<llvm::yaml::Hex16>(this,&local_1c,true,&local_19);
    pAVar2 = Hex16::operator_cast_to_unsigned_short_(&local_1c);
    *pAStack_18 = *pAVar2;
  }
  return;
}

Assistant:

void enumFallback(T &Val) {
    if (matchEnumFallback()) {
      EmptyContext Context;
      // FIXME: Force integral conversion to allow strong typedefs to convert.
      FBT Res = static_cast<typename FBT::BaseType>(Val);
      yamlize(*this, Res, true, Context);
      Val = static_cast<T>(static_cast<typename FBT::BaseType>(Res));
    }
  }